

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O3

char ncnn::float32_to_int8(float value)

{
  char cVar1;
  float fVar2;
  
  fVar2 = value + *(float *)(&DAT_0016e8ac + (ulong)(value < 0.0) * 4);
  cVar1 = '\x7f';
  if ((fVar2 <= 127.0) && (cVar1 = -0x80, -128.0 <= fVar2)) {
    cVar1 = (char)(int)fVar2;
  }
  return cVar1;
}

Assistant:

signed char float32_to_int8(float value)
{
    float tmp;
    if (value >= 0.f) tmp = value + 0.5f;
    else tmp = value - 0.5f;

    if (tmp > 127)
        return 127;
    if (tmp < -128)
        return -128;

    return static_cast<signed char>(tmp);
}